

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

uint Abc_TtSemiCanonicize(word *pTruth,int nVars,char *pCanonPerm,int *pStoreOut,int fOnlySwap)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint jVar;
  long lVar9;
  int *pStore;
  int pStoreIn [17];
  
  pStore = pStoreIn;
  if (pStoreOut != (int *)0x0) {
    pStore = pStoreOut;
  }
  iVar6 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar6 = 1;
  }
  if (nVars < 0x11) {
    uVar4 = 0;
    uVar7 = 0;
    if (0 < nVars) {
      uVar7 = (ulong)(uint)nVars;
    }
    for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      pCanonPerm[uVar4] = (char)uVar4;
    }
    iVar2 = Abc_TtCountOnesInTruth(pTruth,nVars);
    if (fOnlySwap == 0 &&
        (iVar2 != iVar6 * 0x20 && SBORROW4(iVar2,iVar6 * 0x20) == iVar2 + iVar6 * -0x20 < 0)) {
      Abc_TtNot(pTruth,iVar6);
      iVar2 = iVar6 * 0x40 - iVar2;
      uVar8 = 1 << ((byte)nVars & 0x1f);
    }
    else {
      uVar8 = 0;
    }
    Abc_TtCountOnesInCofs(pTruth,nVars,pStore);
    pStore[nVars] = iVar2;
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      if ((fOnlySwap == 0) && (pStore[uVar4] < iVar2 - pStore[uVar4])) {
        Abc_TtFlip(pTruth,iVar6,(uint)uVar4);
        uVar8 = uVar8 | 1 << ((uint)uVar4 & 0x1f);
        pStore[uVar4] = iVar2 - pStore[uVar4];
      }
    }
    iVar6 = 1;
    if (1 < nVars) {
      iVar6 = nVars;
    }
    lVar9 = 2;
    uVar4 = 0;
    while (uVar4 != iVar6 - 1) {
      uVar7 = uVar4 + 1 & 0xffffffff;
      lVar5 = lVar9;
      while( true ) {
        jVar = (uint)uVar7;
        if (nVars <= (int)(uint)lVar5) break;
        uVar3 = (uint)lVar5;
        if (pStore[(int)jVar] <= pStore[lVar5]) {
          uVar3 = jVar;
        }
        lVar5 = lVar5 + 1;
        uVar7 = (ulong)uVar3;
      }
      if (pStore[(int)jVar] < pStore[uVar4]) {
        cVar1 = pCanonPerm[uVar4];
        pCanonPerm[uVar4] = pCanonPerm[(int)jVar];
        pCanonPerm[(int)jVar] = cVar1;
        iVar2 = pStore[uVar4];
        pStore[uVar4] = pStore[(int)jVar];
        pStore[(int)jVar] = iVar2;
        uVar8 = uVar8 ^ (1 << ((byte)uVar7 & 0x1f) ^ 1 << ((uint)uVar4 & 0x1f)) &
                        -((uVar8 >> ((byte)uVar7 & 0x1f) ^ uVar8 >> ((byte)uVar4 & 0x1f)) & 1);
        Abc_TtSwapVars(pTruth,nVars,(uint)uVar4,jVar);
      }
      lVar9 = lVar9 + 1;
      uVar4 = uVar4 + 1;
    }
    return uVar8;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                ,0x24e,"unsigned int Abc_TtSemiCanonicize(word *, int, char *, int *, int)");
}

Assistant:

static inline unsigned Abc_TtSemiCanonicize( word * pTruth, int nVars, char * pCanonPerm, int * pStoreOut, int fOnlySwap )
{
    int fUseOld = 1;
    int fOldSwap = 0;
    int pStoreIn[17];
    int * pStore = pStoreOut ? pStoreOut : pStoreIn;
    int i, nOnes, nWords = Abc_TtWordNum( nVars );
    unsigned uCanonPhase = 0;
    assert( nVars <= 16 );
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    if ( fUseOld )
    {
        // normalize polarity    
        nOnes = Abc_TtCountOnesInTruth( pTruth, nVars );
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        Abc_TtCountOnesInCofs( pTruth, nVars, pStore );
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }
    else
    {
        nOnes = Abc_TtCountOnesInCofsQuick( pTruth, nVars, pStore );
        // normalize polarity    
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            for ( i = 0; i < nVars; i++ )
                pStore[i] = nWords * 32 - pStore[i]; 
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }

    // normalize permutation
    if ( fOldSwap )
    {
        int fChange;
        do {
            fChange = 0;
            for ( i = 0; i < nVars-1; i++ )
            {
                if ( pStore[i] <= pStore[i+1] )
    //            if ( pStore[i] >= pStore[i+1] )
                    continue;
                ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
                ABC_SWAP( int, pStore[i], pStore[i+1] );
                if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> (i+1)) & 1) )
                {
                    uCanonPhase ^= (1 << i);
                    uCanonPhase ^= (1 << (i+1));
                }
                Abc_TtSwapAdjacent( pTruth, nWords, i );            
                fChange = 1;
    //            nSwaps++;
            }
        } 
        while ( fChange );
    }
    else
    {
        int k, BestK;
        for ( i = 0; i < nVars - 1; i++ )
        {
            BestK = i + 1;
            for ( k = i + 2; k < nVars; k++ )
                if ( pStore[BestK] > pStore[k] )
    //            if ( pStore[BestK] < pStore[k] )
                    BestK = k;
            if ( pStore[i] <= pStore[BestK] )
    //        if ( pStore[i] >= pStore[BestK] )
                continue;
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[BestK] );
            ABC_SWAP( int, pStore[i], pStore[BestK] );
            if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> BestK) & 1) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << BestK);
            }
            Abc_TtSwapVars( pTruth, nVars, i, BestK );
    //        nSwaps++;
        }
    }
    return uCanonPhase;
}